

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DSectorPlaneInterpolation::UpdateInterpolation(DSectorPlaneInterpolation *this)

{
  double dVar1;
  DSectorPlaneInterpolation *this_local;
  
  if ((this->ceiling & 1U) == 0) {
    dVar1 = secplane_t::fD(&this->sector->floorplane);
    this->oldheight = dVar1;
    dVar1 = sector_t::GetPlaneTexZ(this->sector,0);
    this->oldtexz = dVar1;
  }
  else {
    dVar1 = secplane_t::fD(&this->sector->ceilingplane);
    this->oldheight = dVar1;
    dVar1 = sector_t::GetPlaneTexZ(this->sector,1);
    this->oldtexz = dVar1;
  }
  return;
}

Assistant:

void DSectorPlaneInterpolation::UpdateInterpolation()
{
	if (!ceiling)
	{
		oldheight = sector->floorplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::floor);
	}
	else
	{
		oldheight = sector->ceilingplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::ceiling);
	}
}